

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O3

void mserialize::detail::visit_impl<(anonymous_namespace)::StoreT<unsigned_short>,InputStream>
               (string_view full_tag,string_view tag,StoreT<unsigned_short> *visitor,
               InputStream *istream,int max_recursion)

{
  byte __rhs;
  stringstream *psVar1;
  code *pcVar2;
  double dVar3;
  int max_recursion_00;
  StoreT<unsigned_short> *pSVar4;
  InputStream *istream_00;
  size_t sVar5;
  char extraout_AL;
  bool bVar6;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  char extraout_AL_13;
  char extraout_AL_14;
  char extraout_AL_15;
  char extraout_AL_16;
  char extraout_AL_17;
  char extraout_AL_18;
  char extraout_AL_19;
  char extraout_AL_20;
  char extraout_AL_21;
  char extraout_AL_22;
  char extraout_AL_23;
  char extraout_AL_24;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  long *plVar11;
  runtime_error *prVar12;
  detail *pdVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  ulong uVar15;
  size_t extraout_RDX_02;
  long lVar16;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  char cVar17;
  ulong uVar18;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  detail *pdVar25;
  byte *pbVar26;
  detail *pdVar27;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  string_view full_tag_00;
  string_view tag_00;
  string_view tag_01;
  string_view tag_02;
  string_view tag_03;
  string_view tag_04;
  string_view tag_05;
  string_view tags;
  string_view tags_00;
  string_view tags_01;
  string_view tags_02;
  string_view tags_03;
  string_view tags_04;
  uint8_t discriminator;
  uint16_t S;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  ostream *local_a8;
  int local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  StoreT<unsigned_short> *local_78;
  InputStream *local_70;
  unsigned_short local_62;
  size_t local_60;
  detail *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_t extraout_RDX_03;
  
  uVar18 = tag._len;
  pbVar26 = (byte *)tag._ptr;
  full_tag_00._len = full_tag._len;
  pdVar25 = (detail *)full_tag._ptr;
  if (max_recursion == 0) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,pdVar25,pdVar25 + full_tag_00._len);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   "Recursion limit exceeded while visiting tag: ",&local_98);
    std::runtime_error::runtime_error(prVar12,(string *)local_d0);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (uVar18 == 0) {
    return;
  }
  local_9c = max_recursion;
  __rhs = *pbVar26;
  local_70 = istream;
  if (__rhs < 0x3c) {
    if (__rhs == 0x28) {
      pcVar24 = (char *)0x0;
      if (uVar18 != 1) {
        pcVar24 = (char *)(uVar18 - 2);
      }
      local_78 = visitor;
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      istream_00 = local_70;
      dVar3 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      if (extraout_AL_05 != '\0') {
        pcVar2 = (code *)swi(3);
        (*pcVar2)(SUB84(dVar3,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      pdVar25 = (detail *)(pbVar26 + 1);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
      tags_02._len = extraout_RDX_02;
      tags_02._ptr = pcVar24;
      pcVar10 = (char *)tag_first_size(pdVar25,tags_02);
      pSVar4 = local_78;
      if (pcVar10 != (char *)0x0) {
        local_9c = local_9c + -1;
        pcVar20 = pcVar10;
        if (pcVar24 < pcVar10) {
          pcVar20 = pcVar24;
        }
        pcVar24 = pcVar24 + -(long)pcVar20;
        pdVar27 = (detail *)(pcVar20 + (long)pdVar25);
        do {
          pdVar13 = pdVar27;
          tag_02._len = (size_t)pcVar10;
          tag_02._ptr = (char *)pdVar25;
          visit_impl<(anonymous_namespace)::StoreT<unsigned_short>,InputStream>
                    (full_tag,tag_02,pSVar4,istream_00,local_9c);
          tags_03._len = extraout_RDX_03;
          tags_03._ptr = pcVar24;
          pcVar10 = (char *)tag_first_size(pdVar13,tags_03);
          pcVar20 = pcVar10;
          if (pcVar24 < pcVar10) {
            pcVar20 = pcVar24;
          }
          pcVar24 = pcVar24 + -(long)pcVar20;
          pdVar27 = pdVar13 + (long)pcVar20;
          pdVar25 = pdVar13;
        } while (pcVar10 != (char *)0x0);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar3 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
      if (extraout_AL_06 != '\0') {
        pcVar2 = (code *)swi(3);
        (*pcVar2)(SUB84(dVar3,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      goto LAB_00151758;
    }
    if (__rhs == 0x2f) {
      pbVar26 = pbVar26 + 1;
      if (uVar18 < 3) {
        lVar19 = 0;
        if (uVar18 != 1) {
          lVar19 = uVar18 - 2;
        }
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,pbVar26,pbVar26 + lVar19);
        std::operator+(&local_98,"Invalid enum tag: \'",&local_50);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_d0._0_8_ = *plVar11;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._0_8_ == paVar14) {
          local_c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_c0._8_8_ = plVar11[3];
          local_d0._0_8_ = &local_c0;
        }
        else {
          local_c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        }
        local_d0._8_8_ = plVar11[1];
        *plVar11 = (long)paVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::runtime_error::runtime_error(prVar12,(string *)local_d0);
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_98.field_2._8_8_ = local_98.field_2._M_local_buf + 3;
      visit_arithmetic<mserialize::detail::IntegerToHex,InputStream>
                (*pbVar26,(IntegerToHex *)&local_98,istream);
      *(char *)(local_98.field_2._8_8_ + -1) = '\'';
      local_98.field_2._M_local_buf[3] = '`';
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar3 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
      if (extraout_AL_02 != '\0') {
        pcVar2 = (code *)swi(3);
        (*pcVar2)(SUB84(dVar3,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      goto LAB_00151758;
    }
LAB_0015110b:
    psVar1 = istream->stream;
    if (__rhs < 0x62) {
      if (__rhs < 0x49) {
        if (__rhs == 0x42) {
          std::istream::read((char *)psVar1,(long)&local_98);
          doctest::detail::MessageBuilder::MessageBuilder
                    ((MessageBuilder *)local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
          dVar3 = doctest::detail::MessageBuilder::log
                            ((MessageBuilder *)local_d0,
                             (double)CONCAT44(extraout_XMM0_Db_23,extraout_XMM0_Da_23));
          if (extraout_AL_23 != '\0') {
            pcVar2 = (code *)swi(3);
            (*pcVar2)(SUB84(dVar3,0));
            return;
          }
          doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        }
        else {
          if (__rhs != 0x44) goto switchD_00151139_caseD_65;
          std::istream::read((char *)psVar1,(long)&local_98);
          doctest::detail::MessageBuilder::MessageBuilder
                    ((MessageBuilder *)local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
          dVar3 = doctest::detail::MessageBuilder::log
                            ((MessageBuilder *)local_d0,
                             (double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
          if (extraout_AL_11 != '\0') {
            pcVar2 = (code *)swi(3);
            (*pcVar2)(SUB84(dVar3,0));
            return;
          }
          doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        }
      }
      else if (__rhs == 0x49) {
        std::istream::read((char *)psVar1,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar3 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_22,extraout_XMM0_Da_22));
        if (extraout_AL_22 != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      }
      else {
        if (__rhs != 0x4c) {
          if (__rhs == 0x53) {
            std::istream::read((char *)psVar1,(long)&local_62);
            doctest::detail::ExpressionDecomposer::ExpressionDecomposer
                      ((ExpressionDecomposer *)&local_50,DT_CHECK);
            local_98._M_dataplus._M_p =
                 (pointer)((long)local_50._M_dataplus._M_p << 0x20 | (ulong)visitor->_has_visit ^ 1)
            ;
            doctest::detail::Expression_lhs::operator_cast_to_Result
                      ((Result *)local_d0,(Expression_lhs *)&local_98);
            doctest::detail::decomp_assert
                      ((detail *)0xa,0x1b7338,(char *)0x22,0x1b8b14,(char *)local_d0,
                       (Result *)istream);
            doctest::String::~String((String *)(local_d0 + 8));
            visitor->_has_visit = true;
            visitor->_value = local_62;
            return;
          }
          goto switchD_00151139_caseD_65;
        }
        std::istream::read((char *)psVar1,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar3 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_21,extraout_XMM0_Da_21));
        if (extraout_AL_21 != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      }
    }
    else {
      switch(__rhs) {
      case 0x62:
        std::istream::read((char *)psVar1,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar3 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
        if (extraout_AL_07 != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        break;
      case 99:
        std::istream::read((char *)psVar1,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar3 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_17,extraout_XMM0_Da_17));
        if (extraout_AL_17 != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        break;
      case 100:
        std::istream::read((char *)psVar1,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar3 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_16,extraout_XMM0_Da_16));
        if (extraout_AL_16 != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        break;
      case 0x65:
      case 0x67:
      case 0x68:
      case 0x6a:
      case 0x6b:
switchD_00151139_caseD_65:
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid arithmetic tag: ","");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                       ,&local_98,__rhs);
        std::runtime_error::runtime_error(prVar12,(string *)local_d0);
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      case 0x66:
        std::istream::read((char *)psVar1,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar3 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_19,extraout_XMM0_Da_19));
        if (extraout_AL_19 != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        break;
      case 0x69:
        std::istream::read((char *)psVar1,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar3 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20));
        if (extraout_AL_20 != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        break;
      case 0x6c:
        std::istream::read((char *)psVar1,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar3 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_18,extraout_XMM0_Da_18));
        if (extraout_AL_18 != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        break;
      default:
        if (__rhs == 0x73) {
          std::istream::read((char *)psVar1,(long)&local_98);
          doctest::detail::MessageBuilder::MessageBuilder
                    ((MessageBuilder *)local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
          dVar3 = doctest::detail::MessageBuilder::log
                            ((MessageBuilder *)local_d0,
                             (double)CONCAT44(extraout_XMM0_Db_24,extraout_XMM0_Da_24));
          if (extraout_AL_24 != '\0') {
            pcVar2 = (code *)swi(3);
            (*pcVar2)(SUB84(dVar3,0));
            return;
          }
          doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        }
        else {
          if (__rhs != 0x79) goto switchD_00151139_caseD_65;
          std::istream::read((char *)psVar1,(long)&local_98);
          doctest::detail::MessageBuilder::MessageBuilder
                    ((MessageBuilder *)local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
          dVar3 = doctest::detail::MessageBuilder::log
                            ((MessageBuilder *)local_d0,
                             (double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
          if (extraout_AL_10 != '\0') {
            pcVar2 = (code *)swi(3);
            (*pcVar2)(SUB84(dVar3,0));
            return;
          }
          doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        }
      }
    }
    goto LAB_00151758;
  }
  if (__rhs == 0x3c) {
    pdVar25 = (detail *)(pbVar26 + 1);
    pcVar24 = (char *)0x0;
    if (uVar18 != 1) {
      pcVar24 = (char *)(uVar18 - 2);
    }
    local_78 = visitor;
    std::istream::read((char *)istream->stream,(long)&local_98);
    sVar8 = extraout_RDX_00;
    for (cVar17 = (char)local_98._M_dataplus._M_p; cVar17 != '\0'; cVar17 = cVar17 + -1) {
      tags_00._len = sVar8;
      tags_00._ptr = pcVar24;
      pcVar10 = (char *)tag_first_size(pdVar25,tags_00);
      if (pcVar24 < pcVar10) {
        pcVar10 = pcVar24;
      }
      pdVar25 = pdVar25 + (long)pcVar10;
      pcVar24 = pcVar24 + -(long)pcVar10;
      sVar8 = extraout_RDX_01;
    }
    tags_01._len = sVar8;
    tags_01._ptr = pcVar24;
    sVar8 = tag_first_size(pdVar25,tags_01);
    doctest::detail::MessageBuilder::MessageBuilder
              ((MessageBuilder *)local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
               ,0x2b,is_require);
    std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
    dVar3 = doctest::detail::MessageBuilder::log
                      ((MessageBuilder *)local_d0,
                       (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
    if (extraout_AL_03 != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
    doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
    if ((sVar8 == 1) && (*pdVar25 == (detail)0x30)) {
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar3 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      if (extraout_AL_04 != '\0') {
        pcVar2 = (code *)swi(3);
        (*pcVar2)(SUB84(dVar3,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
    }
    else {
      tag_03._len = sVar8;
      tag_03._ptr = (char *)pdVar25;
      visit_impl<(anonymous_namespace)::StoreT<unsigned_short>,InputStream>
                (full_tag,tag_03,local_78,istream,max_recursion + -1);
    }
    doctest::detail::MessageBuilder::MessageBuilder
              ((MessageBuilder *)local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
               ,0x28,is_require);
    std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
    dVar3 = doctest::detail::MessageBuilder::log
                      ((MessageBuilder *)local_d0,
                       (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
    if (extraout_AL_08 != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
    goto LAB_00151758;
  }
  if (__rhs == 0x7b) {
    uVar18 = uVar18 - 1;
    if (uVar18 != 0) {
      uVar15 = 0;
      do {
        uVar9 = uVar15;
        if (pbVar26[uVar15] == 0x60) break;
        uVar15 = uVar15 + 1;
        uVar9 = uVar18;
      } while (uVar18 != uVar15);
      uVar15 = uVar9;
      if (uVar18 < uVar9) {
        uVar15 = uVar18;
      }
      lVar19 = uVar18 - uVar15;
      if (lVar19 != 0) {
        pdVar27 = (detail *)(pbVar26 + uVar15);
        goto LAB_00151587;
      }
      if (uVar9 != 0) {
        lVar19 = 0;
        uVar18 = full_tag_00._len;
        pdVar27 = pdVar25;
LAB_001513ae:
        pdVar13 = pdVar27;
        uVar15 = uVar18;
        if (uVar15 != 0) {
          pdVar27 = pdVar13;
          uVar18 = uVar15;
          do {
            uVar23 = 0;
LAB_001513ca:
            uVar21 = 0xffffffffffffffff;
            if (uVar18 == uVar23) goto LAB_001513fd;
            if (pdVar27[uVar23] == *(detail *)(pbVar26 + uVar23)) goto code_r0x001513e0;
            pdVar27 = pdVar27 + 1;
            uVar18 = uVar18 - 1;
          } while( true );
        }
LAB_00151584:
        pdVar27 = (detail *)0x0;
        goto LAB_00151587;
      }
    }
    pdVar27 = (detail *)0x0;
LAB_001512cb:
    lVar19 = 0;
    goto LAB_00151587;
  }
  if (__rhs != 0x5b) goto LAB_0015110b;
  pdVar25 = (detail *)(pbVar26 + 1);
  local_78 = visitor;
  std::istream::read((char *)istream->stream,(long)&local_98);
  tags._len = extraout_RDX;
  tags._ptr = (char *)(uVar18 - 1);
  sVar8 = tag_first_size(pdVar25,tags);
  doctest::detail::MessageBuilder::MessageBuilder
            ((MessageBuilder *)local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
             ,0x2b,is_require);
  std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
  dVar3 = doctest::detail::MessageBuilder::log
                    ((MessageBuilder *)local_d0,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da))
  ;
  if (extraout_AL != '\0') {
    pcVar2 = (code *)swi(3);
    (*pcVar2)(SUB84(dVar3,0));
    return;
  }
  doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
  local_9c = local_9c + -1;
  doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
  uVar7 = (uint)local_98._M_dataplus._M_p;
  if ((uint)local_98._M_dataplus._M_p < 0x21) {
LAB_001512f7:
    pSVar4 = local_78;
    max_recursion_00 = local_9c;
    local_98._M_dataplus._M_p._0_4_ = uVar7 - 1;
    sVar5 = local_60;
    while (local_60 = sVar8, uVar7 != 0) {
      tag_04._len = local_60;
      tag_04._ptr = (char *)pdVar25;
      visit_impl<(anonymous_namespace)::StoreT<unsigned_short>,InputStream>
                (full_tag,tag_04,pSVar4,istream,max_recursion_00);
      uVar7 = (uint)local_98._M_dataplus._M_p;
      local_98._M_dataplus._M_p._0_4_ = (uint)local_98._M_dataplus._M_p - 1;
      sVar8 = local_60;
      sVar5 = local_60;
    }
  }
  else {
    tag_00._len = sVar8;
    tag_00._ptr = (char *)pdVar25;
    bVar6 = singular_impl(full_tag,tag_00,local_9c);
    if (!bVar6) {
      uVar7 = (uint)local_98._M_dataplus._M_p;
      goto LAB_001512f7;
    }
    doctest::detail::MessageBuilder::MessageBuilder
              ((MessageBuilder *)local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
               ,0x28,is_require);
    std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
    dVar3 = doctest::detail::MessageBuilder::log
                      ((MessageBuilder *)local_d0,
                       (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    if (extraout_AL_00 != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
    doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
    tag_01._len = sVar8;
    tag_01._ptr = (char *)pdVar25;
    visit_impl<(anonymous_namespace)::StoreT<unsigned_short>,InputStream>
              (full_tag,tag_01,local_78,istream,local_9c);
    doctest::detail::MessageBuilder::MessageBuilder
              ((MessageBuilder *)local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
               ,0x28,is_require);
    std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
    dVar3 = doctest::detail::MessageBuilder::log
                      ((MessageBuilder *)local_d0,
                       (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    if (extraout_AL_01 != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
    doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
    sVar5 = local_60;
  }
  local_60 = sVar5;
  doctest::detail::MessageBuilder::MessageBuilder
            ((MessageBuilder *)local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
             ,0x28,is_require);
  std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
  dVar3 = doctest::detail::MessageBuilder::log
                    ((MessageBuilder *)local_d0,
                     (double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
  if (extraout_AL_09 != '\0') {
    pcVar2 = (code *)swi(3);
    (*pcVar2)(SUB84(dVar3,0));
    return;
  }
  doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
LAB_00151758:
  doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
  return;
code_r0x001513e0:
  uVar23 = uVar23 + 1;
  if (uVar9 == uVar23) {
    if (pdVar27 != pdVar13 + uVar15) {
      uVar21 = (long)pdVar27 - (long)pdVar13;
    }
LAB_001513fd:
    uVar23 = uVar21;
    if (uVar15 < uVar21) {
      uVar23 = uVar15;
    }
    uVar18 = uVar15 - uVar23;
    uVar22 = uVar9;
    if (uVar18 < uVar9) {
      uVar22 = uVar18;
    }
    uVar18 = uVar18 - uVar22;
    if ((uVar18 == 0) || (pdVar13[uVar22 + uVar23] == (detail)0x7d)) goto LAB_00151584;
    pdVar27 = pdVar13 + uVar22 + uVar23;
    if (pdVar13[uVar22 + uVar23] != (detail)0x60) goto LAB_001513ae;
    if (uVar18 == 1) goto LAB_001512cb;
    if (uVar15 <= uVar21) {
      uVar21 = uVar15;
    }
    uVar15 = uVar15 - uVar21;
    if (uVar15 <= uVar9) {
      uVar9 = uVar15;
    }
    lVar19 = 1;
    lVar16 = 1;
    goto LAB_0015146d;
  }
  goto LAB_001513ca;
LAB_0015146d:
  do {
    if (pdVar13[lVar19 + uVar9 + uVar21] == (detail)0x7d) {
      lVar16 = lVar16 + -1;
      if (lVar16 == 0) goto LAB_00151587;
    }
    else if (pdVar13[lVar19 + uVar9 + uVar21] == (detail)0x7b) {
      lVar16 = lVar16 + 1;
    }
    lVar19 = lVar19 + 1;
  } while (uVar15 - uVar9 != lVar19);
  lVar19 = uVar18 - 1;
LAB_00151587:
  local_78 = visitor;
  local_58 = pdVar25;
  doctest::detail::MessageBuilder::MessageBuilder
            ((MessageBuilder *)local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
             ,0x2b,is_require);
  std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
  dVar3 = doctest::detail::MessageBuilder::log
                    ((MessageBuilder *)local_d0,
                     (double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
  if (extraout_AL_12 != '\0') {
    pcVar2 = (code *)swi(3);
    (*pcVar2)(SUB84(dVar3,0));
    return;
  }
  doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
  doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
  if (lVar19 != 0) {
    local_9c = local_9c + -1;
    sVar8 = extraout_RDX_04;
    do {
      uVar18 = lVar19 - 1;
      if (uVar18 == 0) {
        uVar15 = 1;
      }
      else {
        uVar9 = 0;
        do {
          uVar15 = uVar9;
          if (pdVar27[uVar9 + 1] == (detail)0x27) break;
          uVar9 = uVar9 + 1;
          uVar15 = uVar18;
        } while (uVar18 != uVar9);
        uVar15 = uVar15 + 1;
      }
      if (uVar18 < uVar15) {
        uVar15 = uVar18;
      }
      pdVar27 = pdVar27 + uVar15 + 1;
      pcVar20 = (char *)(uVar18 - uVar15);
      tags_04._len = sVar8;
      tags_04._ptr = pcVar20;
      pcVar10 = (char *)tag_first_size(pdVar27,tags_04);
      pcVar24 = pcVar10;
      if (pcVar20 < pcVar10) {
        pcVar24 = pcVar20;
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar3 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13));
      if (extraout_AL_13 != '\0') {
        pcVar2 = (code *)swi(3);
        (*pcVar2)(SUB84(dVar3,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
      full_tag_00._ptr = (char *)local_58;
      tag_05._len = (size_t)pcVar10;
      tag_05._ptr = (char *)pdVar27;
      visit_impl<(anonymous_namespace)::StoreT<unsigned_short>,InputStream>
                (full_tag_00,tag_05,local_78,local_70,local_9c);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar3 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14));
      if (extraout_AL_14 != '\0') {
        pcVar2 = (code *)swi(3);
        (*pcVar2)(SUB84(dVar3,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      pdVar27 = pdVar27 + (long)pcVar24;
      lVar19 = (long)pcVar20 - (long)pcVar24;
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
      sVar8 = extraout_RDX_05;
    } while (lVar19 != 0);
  }
  doctest::detail::MessageBuilder::MessageBuilder
            ((MessageBuilder *)local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
             ,0x28,is_require);
  std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
  dVar3 = doctest::detail::MessageBuilder::log
                    ((MessageBuilder *)local_d0,
                     (double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15));
  if (extraout_AL_15 != '\0') {
    pcVar2 = (code *)swi(3);
    (*pcVar2)(SUB84(dVar3,0));
    return;
  }
  doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
  goto LAB_00151758;
}

Assistant:

void visit_impl(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return; }

  switch (tag.front())
  {
  case '[':
    visit_sequence(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '(':
    visit_tuple(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '<':
    visit_variant(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '{':
    visit_struct(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '/':
    visit_enum(tag, visitor, istream);
    break;
  default:
    visit_arithmetic(tag.front(), visitor, istream);
  }
}